

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void __thiscall btLCP::transfer_i_from_N_to_C(btLCP *this,int i)

{
  int iVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  int *piVar4;
  uint n;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  btScalar **A;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  btScalar bVar13;
  int in_stack_ffffffffffffffe0;
  
  n = this->m_nC;
  A = this->m_A;
  pbVar2 = A[i];
  if ((long)(int)n < 1) {
    *this->m_d = 1.0 / pbVar2[i];
  }
  else {
    pbVar3 = this->m_Dell;
    piVar4 = this->m_C;
    uVar11 = this->m_nub;
    if ((long)(int)uVar11 < 1) {
      uVar11 = 0;
    }
    else {
      lVar8 = 0;
      do {
        pbVar3[lVar8] = pbVar2[lVar8];
        lVar8 = lVar8 + 1;
      } while ((int)uVar11 != lVar8);
    }
    if ((int)uVar11 < (int)n) {
      uVar7 = (ulong)uVar11;
      do {
        pbVar3[uVar7] = pbVar2[piVar4[uVar7]];
        uVar7 = uVar7 + 1;
      } while ((long)(int)n != uVar7);
    }
    in_stack_ffffffffffffffe0 = 0x1cbcc8;
    btSolveL1(this->m_L,pbVar3,n,this->m_nskip);
    n = this->m_nC;
    lVar8 = (long)(int)n;
    pbVar2 = this->m_d;
    if (lVar8 < 1) {
      A = this->m_A;
      bVar13 = A[i][i];
      fVar12 = 0.0;
    }
    else {
      iVar1 = this->m_nskip;
      pbVar3 = this->m_L;
      pfVar6 = this->m_ell;
      pfVar5 = this->m_Dell;
      lVar9 = 0;
      do {
        fVar12 = pfVar5[lVar9] * pbVar2[lVar9];
        pfVar6[lVar9] = fVar12;
        pbVar3[(int)(iVar1 * n) + lVar9] = fVar12;
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
      A = this->m_A;
      uVar10 = n - 2;
      fVar12 = 0.0;
      uVar11 = n;
      if (n != 1) {
        do {
          fVar12 = pfVar6[1] * pfVar5[1] + *pfVar6 * *pfVar5 + fVar12;
          pfVar6 = pfVar6 + 2;
          pfVar5 = pfVar5 + 2;
          uVar11 = uVar11 - 2;
        } while (1 < uVar11);
        uVar10 = (n - (uVar10 & 0xfffffffe)) - 4;
      }
      bVar13 = A[i][i];
      if (uVar10 == 0xffffffff) {
        fVar12 = fVar12 + *pfVar6 * *pfVar5;
      }
    }
    pbVar2[lVar8] = 1.0 / (bVar13 - fVar12);
  }
  btSwapProblem(A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,this->m_state,
                this->m_findex,this->m_n,n,i,1,in_stack_ffffffffffffffe0);
  iVar1 = this->m_nC;
  this->m_C[iVar1] = iVar1;
  this->m_nN = this->m_nN + -1;
  this->m_nC = iVar1 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_from_N_to_C (int i)
{
  {
    if (m_nC > 0) {
      {
        btScalar *const aptr = BTAROW(i);
        btScalar *Dell = m_Dell;
        const int *C = m_C;
#   ifdef BTNUB_OPTIMIZATIONS
        // if nub>0, initial part of aptr unpermuted
        const int nub = m_nub;
        int j=0;
        for ( ; j<nub; ++j) Dell[j] = aptr[j];
        const int nC = m_nC;
        for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
      }
      btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip;
        btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j] = Dell[j] * d[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nN--;
    m_nC = nC + 1; // nC value is outdated after this line
  }

  // @@@ TO DO LATER
  // if we just finish here then we'll go back and re-solve for
  // delta_x. but actually we can be more efficient and incrementally
  // update delta_x here. but if we do this, we wont have ell and Dell
  // to use in updating the factorization later.

}